

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Parser * Catch::makeCommandLineParser(Parser *__return_storage_ptr__,ConfigData *config)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Parser local_2728;
  Parser local_26c8;
  Parser local_2668;
  Parser local_2608;
  Parser local_25a8;
  Parser local_2548;
  Parser local_24e8;
  Parser local_2488;
  Parser local_2428;
  Parser local_23c8;
  Parser local_2368;
  Parser local_2308;
  Parser local_22a8;
  Parser local_2248;
  Parser local_21e8;
  Parser local_2188;
  Parser local_2128;
  Parser local_20c8;
  Parser local_2068;
  Parser local_2008;
  Parser local_1fa8;
  Parser local_1f48;
  Parser local_1ee8;
  Parser local_1e88;
  Parser local_1e28;
  Parser local_1dc8;
  Parser local_1d68;
  Parser local_1d08;
  Parser local_1ca8;
  Parser local_1c48;
  Parser local_1be8;
  Help local_1b88;
  undefined1 local_1b10 [64];
  _Alloc_hider local_1ad0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1ac0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1ab0;
  undefined1 local_1a98 [64];
  _Alloc_hider local_1a58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a38;
  undefined1 local_1a20 [64];
  _Alloc_hider local_19e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_19d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_19c0;
  undefined1 local_19a8 [64];
  _Alloc_hider local_1968;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1958;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1948;
  undefined1 local_1930 [64];
  _Alloc_hider local_18f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18d0;
  undefined1 local_18b8 [64];
  _Alloc_hider local_1878;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1868;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1858;
  undefined1 local_1840 [64];
  _Alloc_hider local_1800;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_17f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_17e0;
  undefined1 local_17c8 [64];
  _Alloc_hider local_1788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1778;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1768;
  undefined1 local_1750 [64];
  _Alloc_hider local_1710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1700;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_16f0;
  undefined1 local_16d8 [64];
  _Alloc_hider local_1698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1688;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1678;
  undefined1 local_1660 [64];
  _Alloc_hider local_1620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1610;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1600;
  undefined1 local_15e8 [64];
  _Alloc_hider local_15a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1598;
  undefined1 local_1588 [64];
  _Alloc_hider local_1548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1538;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1528;
  undefined1 local_1510 [64];
  _Alloc_hider local_14d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_14c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_14b0;
  undefined1 local_1498 [64];
  _Alloc_hider local_1458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1448;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1438;
  undefined1 local_1420 [64];
  _Alloc_hider local_13e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_13c0;
  undefined1 local_13a8 [64];
  _Alloc_hider local_1368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1348;
  undefined1 local_1330 [64];
  _Alloc_hider local_12f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_12e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_12d0;
  undefined1 local_12b8 [64];
  _Alloc_hider local_1278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1258;
  undefined1 local_1240 [64];
  _Alloc_hider local_1200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_11f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_11e0;
  ExeName local_11c8;
  undefined1 local_11a0 [64];
  _Alloc_hider local_1160;
  size_type local_1158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1140;
  undefined1 local_1128 [32];
  _Alloc_hider local_1108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10f8;
  _Alloc_hider local_10e8;
  size_type local_10e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_10c8;
  undefined1 local_10b0 [32];
  _Alloc_hider local_1090;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1080;
  _Alloc_hider local_1070;
  size_type local_1068;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1060;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1050;
  undefined1 local_1038 [32];
  _Alloc_hider local_1018;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1008;
  _Alloc_hider local_ff8;
  size_type local_ff0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fe8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_fd8;
  undefined1 local_fc0 [32];
  _Alloc_hider local_fa0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f90;
  _Alloc_hider local_f80;
  size_type local_f78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f60;
  undefined1 local_f48 [32];
  _Alloc_hider local_f28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f18;
  _Alloc_hider local_f08;
  size_type local_f00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ef8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ee8;
  undefined1 local_ed0 [32];
  _Alloc_hider local_eb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ea0;
  _Alloc_hider local_e90;
  size_type local_e88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e70;
  undefined1 local_e58 [32];
  _Alloc_hider local_e38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e28;
  _Alloc_hider local_e18;
  size_type local_e10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_df8;
  undefined1 local_de0 [32];
  _Alloc_hider local_dc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_db0;
  _Alloc_hider local_da0;
  size_type local_d98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d80;
  undefined1 local_d68 [32];
  _Alloc_hider local_d48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d38;
  _Alloc_hider local_d28;
  size_type local_d20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d08;
  undefined1 local_cf0 [32];
  _Alloc_hider local_cd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cc0;
  _Alloc_hider local_cb0;
  size_type local_ca8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ca0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c90;
  value_type local_c78;
  string local_c58;
  long *local_c38 [2];
  long local_c28 [2];
  long *local_c18 [2];
  long local_c08 [2];
  value_type local_bf8;
  long *local_bd8 [2];
  long local_bc8 [2];
  long *local_bb8 [2];
  long local_ba8 [2];
  long *local_b98 [2];
  long local_b88 [2];
  value_type local_b78;
  long *local_b58 [2];
  long local_b48 [2];
  string local_b38;
  value_type local_b18;
  long *local_af8 [2];
  long local_ae8 [2];
  long *local_ad8 [2];
  long local_ac8 [2];
  string local_ab8;
  long *local_a98 [2];
  long local_a88 [2];
  long *local_a78 [2];
  long local_a68 [2];
  value_type local_a58;
  long *local_a38 [2];
  long local_a28 [2];
  value_type local_a18;
  long *local_9f8 [2];
  long local_9e8 [2];
  value_type local_9d8;
  value_type local_9b8;
  long *local_998 [2];
  long local_988 [2];
  string local_978;
  value_type local_958;
  value_type local_938;
  long *local_918 [2];
  long local_908 [2];
  value_type local_8f8;
  value_type local_8d8;
  long *local_8b8 [2];
  long local_8a8 [2];
  value_type local_898;
  value_type local_878;
  long *local_858 [2];
  long local_848 [2];
  string local_838;
  value_type local_818;
  value_type local_7f8;
  long *local_7d8 [2];
  long local_7c8 [2];
  value_type local_7b8;
  value_type local_798;
  long *local_778 [2];
  long local_768 [2];
  value_type local_758;
  long *local_738 [2];
  long local_728 [2];
  value_type local_718;
  long *local_6f8 [2];
  long local_6e8 [2];
  value_type local_6d8;
  long *local_6b8 [2];
  long local_6a8 [2];
  value_type local_698;
  long *local_678 [2];
  long local_668 [2];
  value_type local_658;
  long *local_638 [2];
  long local_628 [2];
  value_type local_618;
  long *local_5f8 [2];
  long local_5e8 [2];
  value_type local_5d8;
  long *local_5b8 [2];
  long local_5a8 [2];
  string local_598;
  value_type local_578;
  long *local_558 [2];
  long local_548 [2];
  string local_538;
  value_type local_518;
  long *local_4f8 [2];
  long local_4e8 [2];
  string local_4d8;
  value_type local_4b8;
  long *local_498 [2];
  long local_488 [2];
  value_type local_478;
  long *local_458 [2];
  long local_448 [2];
  string local_438;
  long *local_418 [2];
  long local_408 [2];
  value_type local_3f8;
  value_type local_3d8;
  value_type local_3b8;
  value_type local_398;
  value_type local_378;
  value_type local_358;
  value_type local_338;
  value_type local_318;
  value_type local_2f8;
  long *local_2d8;
  long local_2d0;
  long local_2c8 [2];
  value_type local_2b8;
  value_type local_298;
  value_type local_278;
  value_type local_258;
  value_type local_238;
  value_type local_218;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  value_type local_1d8;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  value_type local_198;
  long *local_178;
  long local_170;
  long local_168 [2];
  long *local_158;
  long local_150;
  long local_148 [2];
  long *local_138;
  long local_130;
  long local_128 [2];
  long *local_118;
  long local_110;
  long local_108 [2];
  long *local_f8;
  long local_f0;
  long local_e8 [2];
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  Parser *local_98;
  Parser *cli;
  ParserBase local_80;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_98 = __return_storage_ptr__;
  clara::detail::ExeName::ExeName(&local_11c8,&config->processName);
  clara::detail::Help::Help(&local_1b88,&config->showHelp);
  clara::detail::ComposableParserImpl<Catch::clara::detail::ExeName>::operator|
            (&local_1be8,&local_11c8.super_ComposableParserImpl<Catch::clara::detail::ExeName>,
             &local_1b88);
  clara::detail::Opt::Opt((Opt *)local_1b10,&config->listTests);
  local_50._M_allocated_capacity = (size_type)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-l","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1ab0,(value_type *)&local_50);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"--list-tests","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1ab0,&local_3f8);
  cli = (Parser *)&local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cli,"list all/matching test cases","");
  std::__cxx11::string::_M_assign((string *)&local_1ad0);
  clara::detail::Parser::operator|(&local_1c48,&local_1be8,(Opt *)local_1b10);
  clara::detail::Opt::Opt((Opt *)local_1a98,&config->listTags);
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"-t","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a38,(value_type *)local_70);
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"--list-tags","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a38,&local_3d8);
  local_c18[0] = local_c08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c18,"list all/matching tags","");
  std::__cxx11::string::_M_assign((string *)&local_1a58);
  clara::detail::Parser::operator|(&local_1ca8,&local_1c48,(Opt *)local_1a98);
  clara::detail::Opt::Opt((Opt *)local_1a20,&config->showSuccessfulTests);
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"-s","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_19c0,&local_3b8);
  local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bf8,"--success","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_19c0,&local_bf8);
  local_bd8[0] = local_bc8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bd8,"include successful tests in output","");
  std::__cxx11::string::_M_assign((string *)&local_19e0);
  clara::detail::Parser::operator|(&local_1d08,&local_1ca8,(Opt *)local_1a20);
  clara::detail::Opt::Opt((Opt *)local_19a8,&config->shouldDebugBreak);
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"-b","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1948,&local_398);
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"--break","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1948,&local_378);
  local_bb8[0] = local_ba8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bb8,"break into debugger on failure","");
  std::__cxx11::string::_M_assign((string *)&local_1968);
  clara::detail::Parser::operator|(&local_1d68,&local_1d08,(Opt *)local_19a8);
  clara::detail::Opt::Opt((Opt *)local_1930,&config->noThrow);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"-e","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_18d0,&local_358);
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"--nothrow","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_18d0,&local_338);
  local_b98[0] = local_b88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b98,"skip exception tests","");
  std::__cxx11::string::_M_assign((string *)&local_18f0);
  clara::detail::Parser::operator|(&local_1dc8,&local_1d68,(Opt *)local_1930);
  clara::detail::Opt::Opt((Opt *)local_18b8,&config->showInvisibles);
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"-i","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1858,&local_318);
  local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b78,"--invisibles","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1858,&local_b78);
  local_b58[0] = local_b48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b58,"show invisibles (tabs, newlines)","");
  std::__cxx11::string::_M_assign((string *)&local_1878);
  clara::detail::Parser::operator|(&local_1e28,&local_1dc8,(Opt *)local_18b8);
  local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b38,"filename","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<std::__cxx11::string>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_1510,&config->outputFilename,
             &local_b38);
  local_1510._0_8_ = &PTR__Opt_002393f0;
  local_14b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_14b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b18,"-o","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_14b0,&local_b18);
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"--out","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_14b0,&local_2f8);
  local_af8[0] = local_ae8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_af8,"output filename","");
  std::__cxx11::string::_M_assign((string *)&local_14d0);
  clara::detail::Parser::operator|(&local_1e88,&local_1e28,(Opt *)local_1510);
  local_2d8 = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"name","");
  local_cf0._0_8_ = &PTR__ParserRefImpl_002394e0;
  local_cf0._8_4_ = Optional;
  local_cf0._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_cf0._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_cf0._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_cf0._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_002384f0;
  local_cf0._16_8_ = local_cf0._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_cf0._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00238540;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_cf0._24_8_ + 0x10))->_M_use_count =
       config;
  local_cd0._M_p = (pointer)&local_cc0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_cd0,local_2d8,local_2d0 + (long)local_2d8);
  local_cb0._M_p = (pointer)&local_ca0;
  local_ca8 = 0;
  local_ca0._M_local_buf[0] = '\0';
  local_cf0._0_8_ = &PTR__Opt_002393f0;
  local_c90.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c90.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c90.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"-r","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c90,&local_2b8);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"--reporter","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c90,&local_298);
  local_ad8[0] = local_ac8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ad8,"reporter to use (defaults to console)","");
  std::__cxx11::string::_M_assign((string *)&local_cb0);
  clara::detail::Parser::operator|(&local_1ee8,&local_1e88,(Opt *)local_cf0);
  local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab8,"name","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<std::__cxx11::string>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_1240,&config->name,&local_ab8);
  local_1240._0_8_ = &PTR__Opt_002393f0;
  local_11e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_11e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"-n","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_11e0,&local_278);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"--name","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_11e0,&local_258);
  local_a98[0] = local_a88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a98,"suite name","");
  std::__cxx11::string::_M_assign((string *)&local_1200);
  clara::detail::Parser::operator|(&local_1f48,&local_1ee8,(Opt *)local_1240);
  local_11a0._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11a0._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11a0._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11a0._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00238590;
  local_11a0._16_8_ = local_11a0._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_11a0._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002385e0;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_11a0._24_8_ + 0x10))->_M_use_count =
       config;
  local_11a0._0_8_ = &PTR__ParserRefImpl_002394e0;
  local_11a0._8_4_ = Optional;
  if (__libc_single_threaded == '\0') {
    LOCK();
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11a0._24_8_)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11a0._24_8_)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11a0._24_8_)->_M_use_count = 2;
  }
  local_11a0._32_8_ = local_11a0 + 0x30;
  local_11a0._40_8_ = 0;
  local_11a0[0x30] = '\0';
  local_1160._M_p = (pointer)&local_1150;
  local_1158 = 0;
  local_1150._M_local_buf[0] = '\0';
  clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11a0._24_8_);
  local_11a0._0_8_ = &PTR__Opt_002393f0;
  local_1140.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1140.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1140.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"-a","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1140,&local_238);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"--abort","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1140,&local_218);
  local_a78[0] = local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"abort at first failure","");
  std::__cxx11::string::_M_assign((string *)&local_1160);
  clara::detail::Parser::operator|(&local_1fa8,&local_1f48,(Opt *)local_11a0);
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"no. failures","");
  local_1128._0_8_ = &PTR__ParserRefImpl_002394e0;
  local_1128._8_4_ = Optional;
  local_1128._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1128._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1128._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1128._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00238630;
  local_1128._16_8_ = local_1128._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1128._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00238680;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1128._24_8_ + 0x10))->_M_use_count =
       config;
  local_1108._M_p = (pointer)&local_10f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1108,local_1f8,local_1f0 + (long)local_1f8);
  local_10e8._M_p = (pointer)&local_10d8;
  local_10e0 = 0;
  local_10d8._M_local_buf[0] = '\0';
  local_1128._0_8_ = &PTR__Opt_002393f0;
  local_10c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_10c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"-x","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_10c8,&local_1d8);
  local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a58,"--abortx","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_10c8,&local_a58);
  local_a38[0] = local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"abort after x failures","");
  std::__cxx11::string::_M_assign((string *)&local_10e8);
  clara::detail::Parser::operator|(&local_2008,&local_1fa8,(Opt *)local_1128);
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"warning name","");
  local_10b0._0_8_ = &PTR__ParserRefImpl_002394e0;
  local_10b0._8_4_ = Optional;
  local_10b0._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10b0._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10b0._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10b0._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_002386d0;
  local_10b0._16_8_ = local_10b0._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_10b0._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00238720;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_10b0._24_8_ + 0x10))->_M_use_count =
       config;
  local_1090._M_p = (pointer)&local_1080;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1090,local_1b8,local_1b0 + (long)local_1b8);
  local_1070._M_p = (pointer)&local_1060;
  local_1068 = 0;
  local_1060._M_local_buf[0] = '\0';
  local_10b0._0_8_ = &PTR__Opt_002393f0;
  local_1050.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1050.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1050.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a18._M_dataplus._M_p = (pointer)&local_a18.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"-w","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1050,&local_a18);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"--warn","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1050,&local_198);
  local_9f8[0] = local_9e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"enable warnings","");
  std::__cxx11::string::_M_assign((string *)&local_1070);
  clara::detail::Parser::operator|(&local_2068,&local_2008,(Opt *)local_10b0);
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"yes|no","");
  local_1038._0_8_ = &PTR__ParserRefImpl_002394e0;
  local_1038._8_4_ = Optional;
  local_1038._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1038._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1038._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1038._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00238770;
  local_1038._16_8_ = local_1038._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1038._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002387c0;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1038._24_8_ + 0x10))->_M_use_count =
       config;
  local_1018._M_p = (pointer)&local_1008;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1018,local_178,local_170 + (long)local_178);
  local_ff8._M_p = (pointer)&local_fe8;
  local_ff0 = 0;
  local_fe8._M_local_buf[0] = '\0';
  local_1038._0_8_ = &PTR__Opt_002393f0;
  local_fd8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_fd8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_fd8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9d8._M_dataplus._M_p = (pointer)&local_9d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d8,"-d","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_fd8,&local_9d8);
  local_9b8._M_dataplus._M_p = (pointer)&local_9b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b8,"--durations","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_fd8,&local_9b8);
  local_998[0] = local_988;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_998,"show test durations","");
  std::__cxx11::string::_M_assign((string *)&local_ff8);
  clara::detail::Parser::operator|(&local_20c8,&local_2068,(Opt *)local_1038);
  local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_978,"seconds","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<double>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_1498,&config->minDuration,&local_978)
  ;
  local_1498._0_8_ = &PTR__Opt_002393f0;
  local_1438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_958,"-D","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1438,&local_958);
  local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_938,"--min-duration","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1438,&local_938);
  local_918[0] = local_908;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_918,
             "show test durations for tests taking at least the given number of seconds","");
  std::__cxx11::string::_M_assign((string *)&local_1458);
  clara::detail::Parser::operator|(&local_2128,&local_20c8,(Opt *)local_1498);
  local_158 = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"filename","");
  local_fc0._0_8_ = &PTR__ParserRefImpl_002394e0;
  local_fc0._8_4_ = Optional;
  local_fc0._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_fc0._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_fc0._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_fc0._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00238810;
  local_fc0._16_8_ = local_fc0._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_fc0._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00238860;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_fc0._24_8_ + 0x10))->_M_use_count =
       config;
  local_fa0._M_p = (pointer)&local_f90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_fa0,local_158,local_150 + (long)local_158);
  local_f80._M_p = (pointer)&local_f70;
  local_f78 = 0;
  local_f70._M_local_buf[0] = '\0';
  local_fc0._0_8_ = &PTR__Opt_002393f0;
  local_f60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f8,"-f","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_f60,&local_8f8);
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d8,"--input-file","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_f60,&local_8d8);
  local_8b8[0] = local_8a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8b8,"load test names to run from a file","");
  std::__cxx11::string::_M_assign((string *)&local_f80);
  clara::detail::Parser::operator|(&local_2188,&local_2128,(Opt *)local_fc0);
  clara::detail::Opt::Opt((Opt *)local_1840,&config->filenamesAsTags);
  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"-#","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_17e0,&local_898);
  local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_878,"--filenames-as-tags","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_17e0,&local_878);
  local_858[0] = local_848;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_858,"adds a tag for the filename","");
  std::__cxx11::string::_M_assign((string *)&local_1800);
  clara::detail::Parser::operator|(&local_21e8,&local_2188,(Opt *)local_1840);
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"section name","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::
  ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_1420,&config->sectionsToRun,
             &local_838);
  local_1420._0_8_ = &PTR__Opt_002393f0;
  local_13c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_13c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_818,"-c","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_13c0,&local_818);
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"--section","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_13c0,&local_7f8);
  local_7d8[0] = local_7c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7d8,"specify section to run","");
  std::__cxx11::string::_M_assign((string *)&local_13e0);
  clara::detail::Parser::operator|(&local_2248,&local_21e8,(Opt *)local_1420);
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"quiet|normal|high","");
  local_f48._0_8_ = &PTR__ParserRefImpl_002394e0;
  local_f48._8_4_ = Optional;
  local_f48._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f48._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f48._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f48._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_002388b0;
  local_f48._16_8_ = local_f48._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f48._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00238900;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f48._24_8_ + 0x10))->_M_use_count =
       config;
  local_f28._M_p = (pointer)&local_f18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f28,local_138,local_130 + (long)local_138);
  local_f08._M_p = (pointer)&local_ef8;
  local_f00 = 0;
  local_ef8._M_local_buf[0] = '\0';
  local_f48._0_8_ = &PTR__Opt_002393f0;
  local_ee8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ee8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ee8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"-v","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_ee8,&local_7b8);
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"--verbosity","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_ee8,&local_798);
  local_778[0] = local_768;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_778,"set output verbosity","");
  std::__cxx11::string::_M_assign((string *)&local_f08);
  clara::detail::Parser::operator|(&local_22a8,&local_2248,(Opt *)local_f48);
  clara::detail::Opt::Opt((Opt *)local_17c8,&config->listTestNamesOnly);
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"--list-test-names-only","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1768,&local_758);
  local_738[0] = local_728;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_738,"list all/matching test cases names only","");
  std::__cxx11::string::_M_assign((string *)&local_1788);
  clara::detail::Parser::operator|(&local_2308,&local_22a8,(Opt *)local_17c8);
  clara::detail::Opt::Opt((Opt *)local_1750,&config->listReporters);
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"--list-reporters","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_16f0,&local_718);
  local_6f8[0] = local_6e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"list all reporters","");
  std::__cxx11::string::_M_assign((string *)&local_1710);
  clara::detail::Parser::operator|(&local_2368,&local_2308,(Opt *)local_1750);
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"decl|lex|rand","");
  local_ed0._0_8_ = &PTR__ParserRefImpl_002394e0;
  local_ed0._8_4_ = Optional;
  local_ed0._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ed0._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ed0._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ed0._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00238950;
  local_ed0._16_8_ = local_ed0._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_ed0._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002389a0;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_ed0._24_8_ + 0x10))->_M_use_count =
       config;
  local_eb0._M_p = (pointer)&local_ea0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_eb0,local_118,local_110 + (long)local_118);
  local_e90._M_p = (pointer)&local_e80;
  local_e88 = 0;
  local_e80._M_local_buf[0] = '\0';
  local_ed0._0_8_ = &PTR__Opt_002393f0;
  local_e70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"--order","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_e70,&local_6d8);
  local_6b8[0] = local_6a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6b8,"test case order (defaults to decl)","");
  std::__cxx11::string::_M_assign((string *)&local_e90);
  clara::detail::Parser::operator|(&local_23c8,&local_2368,(Opt *)local_ed0);
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"\'time\'|number","");
  local_e58._0_8_ = &PTR__ParserRefImpl_002394e0;
  local_e58._8_4_ = Optional;
  local_e58._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e58._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e58._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e58._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_002389f0;
  local_e58._16_8_ = local_e58._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e58._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00238a40;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e58._24_8_ + 0x10))->_M_use_count =
       config;
  local_e38._M_p = (pointer)&local_e28;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e38,local_f8,local_f0 + (long)local_f8)
  ;
  local_e18._M_p = (pointer)&local_e08;
  local_e10 = 0;
  local_e08._M_local_buf[0] = '\0';
  local_e58._0_8_ = &PTR__Opt_002393f0;
  local_df8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_df8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_df8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"--rng-seed","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_df8,&local_698);
  local_678[0] = local_668;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_678,"set a specific seed for random numbers","");
  std::__cxx11::string::_M_assign((string *)&local_e18);
  clara::detail::Parser::operator|(&local_2428,&local_23c8,(Opt *)local_e58);
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"yes|no","");
  local_de0._0_8_ = &PTR__ParserRefImpl_002394e0;
  local_de0._8_4_ = Optional;
  local_de0._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_de0._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_de0._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_de0._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00238a90;
  local_de0._16_8_ = local_de0._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_de0._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00238ae0;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_de0._24_8_ + 0x10))->_M_use_count =
       config;
  local_dc0._M_p = (pointer)&local_db0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_dc0,local_d8,local_d0 + (long)local_d8)
  ;
  local_da0._M_p = (pointer)&local_d90;
  local_d98 = 0;
  local_d90._M_local_buf[0] = '\0';
  local_de0._0_8_ = &PTR__Opt_002393f0;
  local_d80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"--use-colour","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_d80,&local_658);
  local_638[0] = local_628;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_638,"should output be colourised","");
  std::__cxx11::string::_M_assign((string *)&local_da0);
  clara::detail::Parser::operator|(&local_2488,&local_2428,(Opt *)local_de0);
  clara::detail::Opt::Opt((Opt *)local_16d8,&config->libIdentify);
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"--libidentify","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1678,&local_618);
  local_5f8[0] = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5f8,"report name and version according to libidentify standard","");
  std::__cxx11::string::_M_assign((string *)&local_1698);
  clara::detail::Parser::operator|(&local_24e8,&local_2488,(Opt *)local_16d8);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"never|start|exit|both","");
  local_d68._0_8_ = &PTR__ParserRefImpl_002394e0;
  local_d68._8_4_ = Optional;
  local_d68._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d68._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d68._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d68._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00238b30;
  local_d68._16_8_ = local_d68._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d68._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00238b80;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d68._24_8_ + 0x10))->_M_use_count =
       config;
  local_d48._M_p = (pointer)&local_d38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d48,local_b8,local_b0 + (long)local_b8)
  ;
  local_d28._M_p = (pointer)&local_d18;
  local_d20 = 0;
  local_d18._M_local_buf[0] = '\0';
  local_d68._0_8_ = &PTR__Opt_002393f0;
  local_d08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"--wait-for-keypress","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_d08,&local_5d8);
  local_5b8[0] = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5b8,"waits for a keypress before exiting","");
  std::__cxx11::string::_M_assign((string *)&local_d28);
  clara::detail::Parser::operator|(&local_2548,&local_24e8,(Opt *)local_d68);
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"samples","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<unsigned_int>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_13a8,&config->benchmarkSamples,
             &local_598);
  local_13a8._0_8_ = &PTR__Opt_002393f0;
  local_1348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"--benchmark-samples","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1348,&local_578);
  local_558[0] = local_548;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_558,"number of samples to collect (default: 100)","");
  std::__cxx11::string::_M_assign((string *)&local_1368);
  clara::detail::Parser::operator|(&local_25a8,&local_2548,(Opt *)local_13a8);
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"resamples","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<unsigned_int>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_1330,&config->benchmarkResamples,
             &local_538);
  local_1330._0_8_ = &PTR__Opt_002393f0;
  local_12d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_12d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"--benchmark-resamples","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_12d0,&local_518);
  local_4f8[0] = local_4e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4f8,"number of resamples for the bootstrap (default: 100000)","");
  std::__cxx11::string::_M_assign((string *)&local_12f0);
  clara::detail::Parser::operator|(&local_2608,&local_25a8,(Opt *)local_1330);
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"confidence interval","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<double>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_12b8,
             &config->benchmarkConfidenceInterval,&local_4d8);
  local_12b8._0_8_ = &PTR__Opt_002393f0;
  local_1258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4b8,"--benchmark-confidence-interval","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1258,&local_4b8);
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_498,
             "confidence interval for the bootstrap (between 0 and 1, default: 0.95)","");
  std::__cxx11::string::_M_assign((string *)&local_1278);
  clara::detail::Parser::operator|(&local_2668,&local_2608,(Opt *)local_12b8);
  clara::detail::Opt::Opt((Opt *)local_1660,&config->benchmarkNoAnalysis);
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--benchmark-no-analysis","")
  ;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1600,&local_478);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_458,"perform only measurements; do not perform any analysis","");
  std::__cxx11::string::_M_assign((string *)&local_1620);
  clara::detail::Parser::operator|(&local_26c8,&local_2668,(Opt *)local_1660);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"benchmarkWarmupTime","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<long>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_1588,&config->benchmarkWarmupTime,
             &local_438);
  local_1588._0_8_ = &PTR__Opt_002393f0;
  local_1528.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1528.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1528.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c78._M_dataplus._M_p = (pointer)&local_c78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c78,"--benchmark-warmup-time","")
  ;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1528,&local_c78);
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_418,
             "amount of time in milliseconds spent on warming up each test (default: 100)","");
  std::__cxx11::string::_M_assign((string *)&local_1548);
  clara::detail::Parser::operator|(&local_2728,&local_26c8,(Opt *)local_1588);
  local_c58._M_dataplus._M_p = (pointer)&local_c58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c58,"test name|pattern|tags","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Arg>::
  ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((ParserRefImpl<Catch::clara::detail::Arg> *)local_15e8,&config->testsOrTags,&local_c58)
  ;
  local_15e8._0_8_ = &PTR__ParserRefImpl_002395b8;
  local_c38[0] = local_c28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c38,"which test or tests to use","");
  std::__cxx11::string::_M_assign((string *)&local_15a8);
  clara::detail::Parser::operator|(local_98,&local_2728,(Arg *)local_15e8);
  if (local_c38[0] != local_c28) {
    operator_delete(local_c38[0],local_c28[0] + 1);
  }
  local_15e8._0_8_ = &PTR__ParserRefImpl_00239638;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15a8._M_p != &local_1598) {
    operator_delete(local_15a8._M_p,local_1598._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_15e8._32_8_ != local_15e8 + 0x30) {
    operator_delete((void *)local_15e8._32_8_,local_15e8._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_15e8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_15e8._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c58._M_dataplus._M_p != &local_c58.field_2) {
    operator_delete(local_c58._M_dataplus._M_p,local_c58.field_2._M_allocated_capacity + 1);
  }
  local_2728.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_2728.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_2728.m_options);
  local_2728.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_2728.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2728.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2728.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2728.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_418[0] != local_408) {
    operator_delete(local_418[0],local_408[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c78._M_dataplus._M_p != &local_c78.field_2) {
    operator_delete(local_c78._M_dataplus._M_p,local_c78.field_2._M_allocated_capacity + 1);
  }
  local_1588._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1528);
  local_1588._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1548._M_p != &local_1538) {
    operator_delete(local_1548._M_p,local_1538._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1588._32_8_ != local_1588 + 0x30) {
    operator_delete((void *)local_1588._32_8_,local_1588._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1588._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1588._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  local_26c8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_26c8.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_26c8.m_options);
  local_26c8.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_26c8.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_26c8.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_26c8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_26c8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  local_1660._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1600);
  local_1660._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1620._M_p != &local_1610) {
    operator_delete(local_1620._M_p,local_1610._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1660._32_8_ != local_1660 + 0x30) {
    operator_delete((void *)local_1660._32_8_,local_1660._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1660._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1660._24_8_);
  }
  local_2668.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_2668.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_2668.m_options);
  local_2668.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_2668.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2668.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2668.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2668.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  local_12b8._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1258);
  local_12b8._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1278._M_p != &local_1268) {
    operator_delete(local_1278._M_p,local_1268._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_12b8._32_8_ != local_12b8 + 0x30) {
    operator_delete((void *)local_12b8._32_8_,local_12b8._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_12b8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_12b8._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  local_2608.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_2608.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_2608.m_options);
  local_2608.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_2608.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2608.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2608.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2608.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_4f8[0] != local_4e8) {
    operator_delete(local_4f8[0],local_4e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  local_1330._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_12d0);
  local_1330._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f0._M_p != &local_12e0) {
    operator_delete(local_12f0._M_p,local_12e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1330._32_8_ != local_1330 + 0x30) {
    operator_delete((void *)local_1330._32_8_,local_1330._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1330._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1330._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  local_25a8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_25a8.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_25a8.m_options);
  local_25a8.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_25a8.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_25a8.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_25a8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_25a8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_558[0] != local_548) {
    operator_delete(local_558[0],local_548[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  local_13a8._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1348);
  local_13a8._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1368._M_p != &local_1358) {
    operator_delete(local_1368._M_p,local_1358._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_13a8._32_8_ != local_13a8 + 0x30) {
    operator_delete((void *)local_13a8._32_8_,local_13a8._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_13a8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_13a8._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  local_2548.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_2548.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_2548.m_options);
  local_2548.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_2548.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2548.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2548.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2548.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_5b8[0] != local_5a8) {
    operator_delete(local_5b8[0],local_5a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  local_d68._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d08);
  local_d68._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28._M_p != &local_d18) {
    operator_delete(local_d28._M_p,
                    CONCAT71(local_d18._M_allocated_capacity._1_7_,local_d18._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d48._M_p != &local_d38) {
    operator_delete(local_d48._M_p,local_d38._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d68._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d68._24_8_);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  local_24e8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_24e8.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_24e8.m_options);
  local_24e8.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_24e8.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_24e8.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_24e8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_24e8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_5f8[0] != local_5e8) {
    operator_delete(local_5f8[0],local_5e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  local_16d8._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1678);
  local_16d8._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1698._M_p != &local_1688) {
    operator_delete(local_1698._M_p,local_1688._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_16d8._32_8_ != local_16d8 + 0x30) {
    operator_delete((void *)local_16d8._32_8_,local_16d8._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16d8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16d8._24_8_);
  }
  local_2488.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_2488.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_2488.m_options);
  local_2488.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_2488.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2488.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2488.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2488.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_638[0] != local_628) {
    operator_delete(local_638[0],local_628[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  local_de0._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d80);
  local_de0._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_da0._M_p != &local_d90) {
    operator_delete(local_da0._M_p,
                    CONCAT71(local_d90._M_allocated_capacity._1_7_,local_d90._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dc0._M_p != &local_db0) {
    operator_delete(local_dc0._M_p,local_db0._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_de0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_de0._24_8_);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  local_2428.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_2428.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_2428.m_options);
  local_2428.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_2428.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2428.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2428.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2428.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_678[0] != local_668) {
    operator_delete(local_678[0],local_668[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  local_e58._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_df8);
  local_e58._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e18._M_p != &local_e08) {
    operator_delete(local_e18._M_p,
                    CONCAT71(local_e08._M_allocated_capacity._1_7_,local_e08._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_p != &local_e28) {
    operator_delete(local_e38._M_p,local_e28._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e58._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e58._24_8_);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  local_23c8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_23c8.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_23c8.m_options);
  local_23c8.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_23c8.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_23c8.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_23c8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_23c8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_6b8[0] != local_6a8) {
    operator_delete(local_6b8[0],local_6a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  local_ed0._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e70);
  local_ed0._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._M_p != &local_e80) {
    operator_delete(local_e90._M_p,
                    CONCAT71(local_e80._M_allocated_capacity._1_7_,local_e80._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_eb0._M_p != &local_ea0) {
    operator_delete(local_eb0._M_p,local_ea0._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ed0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ed0._24_8_);
  }
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  local_2368.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_2368.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_2368.m_options);
  local_2368.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_2368.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2368.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2368.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2368.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_6f8[0] != local_6e8) {
    operator_delete(local_6f8[0],local_6e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  local_1750._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_16f0);
  local_1750._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1710._M_p != &local_1700) {
    operator_delete(local_1710._M_p,local_1700._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1750._32_8_ != local_1750 + 0x30) {
    operator_delete((void *)local_1750._32_8_,local_1750._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1750._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1750._24_8_);
  }
  local_2308.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_2308.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_2308.m_options);
  local_2308.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_2308.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2308.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2308.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2308.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_738[0] != local_728) {
    operator_delete(local_738[0],local_728[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  local_17c8._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1768);
  local_17c8._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1788._M_p != &local_1778) {
    operator_delete(local_1788._M_p,local_1778._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_17c8._32_8_ != local_17c8 + 0x30) {
    operator_delete((void *)local_17c8._32_8_,local_17c8._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_17c8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_17c8._24_8_);
  }
  local_22a8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_22a8.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_22a8.m_options);
  local_22a8.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_22a8.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_22a8.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_22a8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_22a8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_778[0] != local_768) {
    operator_delete(local_778[0],local_768[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  local_f48._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_ee8);
  local_f48._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f08._M_p != &local_ef8) {
    operator_delete(local_f08._M_p,
                    CONCAT71(local_ef8._M_allocated_capacity._1_7_,local_ef8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f28._M_p != &local_f18) {
    operator_delete(local_f28._M_p,local_f18._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f48._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f48._24_8_);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_2248.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_2248.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_2248.m_options);
  local_2248.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_2248.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2248.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2248.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2248.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_7d8[0] != local_7c8) {
    operator_delete(local_7d8[0],local_7c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != &local_818.field_2) {
    operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
  }
  local_1420._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_13c0);
  local_1420._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e0._M_p != &local_13d0) {
    operator_delete(local_13e0._M_p,local_13d0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1420._32_8_ != local_1420 + 0x30) {
    operator_delete((void *)local_1420._32_8_,local_1420._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1420._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1420._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
  }
  local_21e8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_21e8.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_21e8.m_options);
  local_21e8.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_21e8.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_21e8.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_21e8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_21e8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_858[0] != local_848) {
    operator_delete(local_858[0],local_848[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p,local_878.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
  }
  local_1840._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_17e0);
  local_1840._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1800._M_p != &local_17f0) {
    operator_delete(local_1800._M_p,local_17f0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1840._32_8_ != local_1840 + 0x30) {
    operator_delete((void *)local_1840._32_8_,local_1840._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1840._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1840._24_8_);
  }
  local_2188.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_2188.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_2188.m_options);
  local_2188.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_2188.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2188.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2188.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2188.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_8b8[0] != local_8a8) {
    operator_delete(local_8b8[0],local_8a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
    operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
  }
  local_fc0._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f60);
  local_fc0._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f80._M_p != &local_f70) {
    operator_delete(local_f80._M_p,
                    CONCAT71(local_f70._M_allocated_capacity._1_7_,local_f70._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa0._M_p != &local_f90) {
    operator_delete(local_fa0._M_p,local_f90._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_fc0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_fc0._24_8_);
  }
  if (local_158 != local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  local_2128.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_2128.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_2128.m_options);
  local_2128.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_2128.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2128.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2128.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2128.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_918[0] != local_908) {
    operator_delete(local_918[0],local_908[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_938._M_dataplus._M_p != &local_938.field_2) {
    operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  local_1498._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1438);
  local_1498._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1458._M_p != &local_1448) {
    operator_delete(local_1458._M_p,local_1448._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1498._32_8_ != local_1498 + 0x30) {
    operator_delete((void *)local_1498._32_8_,local_1498._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1498._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1498._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._M_dataplus._M_p != &local_978.field_2) {
    operator_delete(local_978._M_dataplus._M_p,local_978.field_2._M_allocated_capacity + 1);
  }
  local_20c8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_20c8.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_20c8.m_options);
  local_20c8.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_20c8.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20c8.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_20c8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20c8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_998[0] != local_988) {
    operator_delete(local_998[0],local_988[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
    operator_delete(local_9b8._M_dataplus._M_p,local_9b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._M_dataplus._M_p != &local_9d8.field_2) {
    operator_delete(local_9d8._M_dataplus._M_p,local_9d8.field_2._M_allocated_capacity + 1);
  }
  local_1038._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_fd8);
  local_1038._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff8._M_p != &local_fe8) {
    operator_delete(local_ff8._M_p,
                    CONCAT71(local_fe8._M_allocated_capacity._1_7_,local_fe8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1018._M_p != &local_1008) {
    operator_delete(local_1018._M_p,local_1008._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1038._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1038._24_8_);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  local_2068.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_2068.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_2068.m_options);
  local_2068.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_2068.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2068.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2068.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2068.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_9f8[0] != local_9e8) {
    operator_delete(local_9f8[0],local_9e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  local_10b0._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1050);
  local_10b0._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1070._M_p != &local_1060) {
    operator_delete(local_1070._M_p,
                    CONCAT71(local_1060._M_allocated_capacity._1_7_,local_1060._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1090._M_p != &local_1080) {
    operator_delete(local_1090._M_p,local_1080._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10b0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10b0._24_8_);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  local_2008.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_2008.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_2008.m_options);
  local_2008.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_2008.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2008.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2008.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2008.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_a38[0] != local_a28) {
    operator_delete(local_a38[0],local_a28[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  local_1128._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_10c8);
  local_1128._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10e8._M_p != &local_10d8) {
    operator_delete(local_10e8._M_p,
                    CONCAT71(local_10d8._M_allocated_capacity._1_7_,local_10d8._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1108._M_p != &local_10f8) {
    operator_delete(local_1108._M_p,local_10f8._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1128._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1128._24_8_);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  local_1fa8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_1fa8.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_1fa8.m_options);
  local_1fa8.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_1fa8.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1fa8.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1fa8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1fa8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_a78[0] != local_a68) {
    operator_delete(local_a78[0],local_a68[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_11a0._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1140);
  local_11a0._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1160._M_p != &local_1150) {
    operator_delete(local_1160._M_p,
                    CONCAT71(local_1150._M_allocated_capacity._1_7_,local_1150._M_local_buf[0]) + 1)
    ;
  }
  if ((undefined1 *)local_11a0._32_8_ != local_11a0 + 0x30) {
    operator_delete((void *)local_11a0._32_8_,CONCAT71(local_11a0._49_7_,local_11a0[0x30]) + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11a0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11a0._24_8_);
  }
  local_1f48.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_1f48.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_1f48.m_options);
  local_1f48.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_1f48.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f48.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1f48.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f48.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_a98[0] != local_a88) {
    operator_delete(local_a98[0],local_a88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_1240._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_11e0);
  local_1240._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1200._M_p != &local_11f0) {
    operator_delete(local_1200._M_p,local_11f0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1240._32_8_ != local_1240 + 0x30) {
    operator_delete((void *)local_1240._32_8_,local_1240._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1240._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1240._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
    operator_delete(local_ab8._M_dataplus._M_p,local_ab8.field_2._M_allocated_capacity + 1);
  }
  local_1ee8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_1ee8.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_1ee8.m_options);
  local_1ee8.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_1ee8.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1ee8.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1ee8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1ee8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_ad8[0] != local_ac8) {
    operator_delete(local_ad8[0],local_ac8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_cf0._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c90);
  local_cf0._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb0._M_p != &local_ca0) {
    operator_delete(local_cb0._M_p,
                    CONCAT71(local_ca0._M_allocated_capacity._1_7_,local_ca0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd0._M_p != &local_cc0) {
    operator_delete(local_cd0._M_p,local_cc0._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_cf0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_cf0._24_8_);
  }
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8,local_2c8[0] + 1);
  }
  local_1e88.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_1e88.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_1e88.m_options);
  local_1e88.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_1e88.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e88.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1e88.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e88.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_af8[0] != local_ae8) {
    operator_delete(local_af8[0],local_ae8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
    operator_delete(local_b18._M_dataplus._M_p,local_b18.field_2._M_allocated_capacity + 1);
  }
  local_1510._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_14b0);
  local_1510._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14d0._M_p != &local_14c0) {
    operator_delete(local_14d0._M_p,local_14c0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1510._32_8_ != local_1510 + 0x30) {
    operator_delete((void *)local_1510._32_8_,local_1510._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1510._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1510._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
    operator_delete(local_b38._M_dataplus._M_p,local_b38.field_2._M_allocated_capacity + 1);
  }
  local_1e28.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_1e28.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_1e28.m_options);
  local_1e28.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_1e28.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e28.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1e28.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e28.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b58[0] != local_b48) {
    operator_delete(local_b58[0],local_b48[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
    operator_delete(local_b78._M_dataplus._M_p,local_b78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_18b8._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1858);
  local_18b8._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1878._M_p != &local_1868) {
    operator_delete(local_1878._M_p,local_1868._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_18b8._32_8_ != local_18b8 + 0x30) {
    operator_delete((void *)local_18b8._32_8_,local_18b8._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18b8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18b8._24_8_);
  }
  local_1dc8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_1dc8.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_1dc8.m_options);
  local_1dc8.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_1dc8.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1dc8.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1dc8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1dc8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b98[0] != local_b88) {
    operator_delete(local_b98[0],local_b88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_1930._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_18d0);
  local_1930._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18f0._M_p != &local_18e0) {
    operator_delete(local_18f0._M_p,local_18e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1930._32_8_ != local_1930 + 0x30) {
    operator_delete((void *)local_1930._32_8_,local_1930._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1930._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1930._24_8_);
  }
  local_1d68.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_1d68.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_1d68.m_options);
  local_1d68.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_1d68.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d68.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1d68.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d68.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_bb8[0] != local_ba8) {
    operator_delete(local_bb8[0],local_ba8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  local_19a8._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1948);
  local_19a8._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1968._M_p != &local_1958) {
    operator_delete(local_1968._M_p,local_1958._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_19a8._32_8_ != local_19a8 + 0x30) {
    operator_delete((void *)local_19a8._32_8_,local_19a8._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_19a8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_19a8._24_8_);
  }
  local_1d08.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_1d08.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_1d08.m_options);
  local_1d08.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_1d08.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d08.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1d08.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d08.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_bd8[0] != local_bc8) {
    operator_delete(local_bd8[0],local_bc8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
    operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  local_1a20._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_19c0);
  local_1a20._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19e0._M_p != &local_19d0) {
    operator_delete(local_19e0._M_p,local_19d0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1a20._32_8_ != local_1a20 + 0x30) {
    operator_delete((void *)local_1a20._32_8_,local_1a20._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a20._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a20._24_8_);
  }
  local_1ca8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_1ca8.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_1ca8.m_options);
  local_1ca8.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_1ca8.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1ca8.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1ca8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1ca8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c18[0] != local_c08) {
    operator_delete(local_c18[0],local_c08[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_70._0_8_ != (element_type *)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
  }
  local_1a98._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a38);
  local_1a98._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a58._M_p != &local_1a48) {
    operator_delete(local_1a58._M_p,local_1a48._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1a98._32_8_ != local_1a98 + 0x30) {
    operator_delete((void *)local_1a98._32_8_,local_1a98._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a98._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a98._24_8_);
  }
  local_1c48.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_1c48.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_1c48.m_options);
  local_1c48.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_1c48.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c48.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1c48.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c48.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (cli != (Parser *)&local_80) {
    operator_delete(cli,(long)local_80._vptr_ParserBase + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_allocated_capacity != &local_40) {
    operator_delete((void *)local_50._M_allocated_capacity,local_40._M_allocated_capacity + 1);
  }
  local_1b10._0_8_ = &PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1ab0);
  local_1b10._0_8_ = &PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_p != &local_1ac0) {
    operator_delete(local_1ad0._M_p,local_1ac0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1b10._32_8_ != local_1b10 + 0x30) {
    operator_delete((void *)local_1b10._32_8_,local_1b10._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b10._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b10._24_8_);
  }
  local_1be8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00239710;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_1be8.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_1be8.m_options);
  local_1be8.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_1be8.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1be8.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1be8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1be8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1b88.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.
  super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase =
       (ParserBase)&PTR__Opt_002393f0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b88.super_Opt.m_optNames);
  local_1b88.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.
  super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase =
       (ParserBase)&PTR__ParserRefImpl_002394e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b88.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_description.
         _M_dataplus._M_p !=
      &local_1b88.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_description.field_2) {
    operator_delete(local_1b88.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.
                    m_description._M_dataplus._M_p,
                    local_1b88.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.
                    m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b88.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_hint._M_dataplus._M_p
      != &local_1b88.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_hint.field_2) {
    operator_delete(local_1b88.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_hint.
                    _M_dataplus._M_p,
                    local_1b88.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_hint.
                    field_2._M_allocated_capacity + 1);
  }
  if (local_1b88.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b88.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_11c8.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_00238fc0;
  if (local_11c8.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_11c8.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_11c8.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_11c8.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return local_98;
}

Assistant:

clara::Parser makeCommandLineParser(ConfigData& config) {

        using namespace clara;

        auto const setWarning = [&](std::string const& warning) {
            auto warningSet = [&]() {
                if (warning == "NoAssertions")
                    return WarnAbout::NoAssertions;

                if (warning == "NoTests")
                    return WarnAbout::NoTests;

                return WarnAbout::Nothing;
            }();

            if (warningSet == WarnAbout::Nothing)
                return ParserResult::runtimeError("Unrecognised warning: '" + warning + "'");
            config.warnings = static_cast<WarnAbout::What>(config.warnings | warningSet);
            return ParserResult::ok(ParseResultType::Matched);
        };
        auto const loadTestNamesFromFile = [&](std::string const& filename) {
            std::ifstream f(filename.c_str());
            if (!f.is_open())
                return ParserResult::runtimeError("Unable to load input file: '" + filename + "'");

            std::string line;
            while (std::getline(f, line)) {
                line = trim(line);
                if (!line.empty() && !startsWith(line, '#')) {
                    if (!startsWith(line, '"'))
                        line = '"' + line + '"';
                    config.testsOrTags.push_back(line);
                    config.testsOrTags.emplace_back(",");
                }
            }
            //Remove comma in the end
            if (!config.testsOrTags.empty())
                config.testsOrTags.erase(config.testsOrTags.end() - 1);

            return ParserResult::ok(ParseResultType::Matched);
        };
        auto const setTestOrder = [&](std::string const& order) {
            if (startsWith("declared", order))
                config.runOrder = RunTests::InDeclarationOrder;
            else if (startsWith("lexical", order))
                config.runOrder = RunTests::InLexicographicalOrder;
            else if (startsWith("random", order))
                config.runOrder = RunTests::InRandomOrder;
            else
                return clara::ParserResult::runtimeError("Unrecognised ordering: '" + order + "'");
            return ParserResult::ok(ParseResultType::Matched);
        };
        auto const setRngSeed = [&](std::string const& seed) {
            if (seed != "time")
                return clara::detail::convertInto(seed, config.rngSeed);
            config.rngSeed = static_cast<unsigned int>(std::time(nullptr));
            return ParserResult::ok(ParseResultType::Matched);
        };
        auto const setColourUsage = [&](std::string const& useColour) {
            auto mode = toLower(useColour);

            if (mode == "yes")
                config.useColour = UseColour::Yes;
            else if (mode == "no")
                config.useColour = UseColour::No;
            else if (mode == "auto")
                config.useColour = UseColour::Auto;
            else
                return ParserResult::runtimeError("colour mode must be one of: auto, yes or no. '" + useColour + "' not recognised");
            return ParserResult::ok(ParseResultType::Matched);
        };
        auto const setWaitForKeypress = [&](std::string const& keypress) {
            auto keypressLc = toLower(keypress);
            if (keypressLc == "never")
                config.waitForKeypress = WaitForKeypress::Never;
            else if (keypressLc == "start")
                config.waitForKeypress = WaitForKeypress::BeforeStart;
            else if (keypressLc == "exit")
                config.waitForKeypress = WaitForKeypress::BeforeExit;
            else if (keypressLc == "both")
                config.waitForKeypress = WaitForKeypress::BeforeStartAndExit;
            else
                return ParserResult::runtimeError("keypress argument must be one of: never, start, exit or both. '" + keypress + "' not recognised");
            return ParserResult::ok(ParseResultType::Matched);
        };
        auto const setVerbosity = [&](std::string const& verbosity) {
            auto lcVerbosity = toLower(verbosity);
            if (lcVerbosity == "quiet")
                config.verbosity = Verbosity::Quiet;
            else if (lcVerbosity == "normal")
                config.verbosity = Verbosity::Normal;
            else if (lcVerbosity == "high")
                config.verbosity = Verbosity::High;
            else
                return ParserResult::runtimeError("Unrecognised verbosity, '" + verbosity + "'");
            return ParserResult::ok(ParseResultType::Matched);
        };
        auto const setReporter = [&](std::string const& reporter) {
            IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();

            auto lcReporter = toLower(reporter);
            auto result = factories.find(lcReporter);

            if (factories.end() != result)
                config.reporterName = lcReporter;
            else
                return ParserResult::runtimeError("Unrecognized reporter, '" + reporter + "'. Check available with --list-reporters");
            return ParserResult::ok(ParseResultType::Matched);
        };

        auto cli
            = ExeName(config.processName)
            | Help(config.showHelp)
            | Opt(config.listTests)
            ["-l"]["--list-tests"]
            ("list all/matching test cases")
            | Opt(config.listTags)
            ["-t"]["--list-tags"]
            ("list all/matching tags")
            | Opt(config.showSuccessfulTests)
            ["-s"]["--success"]
            ("include successful tests in output")
            | Opt(config.shouldDebugBreak)
            ["-b"]["--break"]
            ("break into debugger on failure")
            | Opt(config.noThrow)
            ["-e"]["--nothrow"]
            ("skip exception tests")
            | Opt(config.showInvisibles)
            ["-i"]["--invisibles"]
            ("show invisibles (tabs, newlines)")
            | Opt(config.outputFilename, "filename")
            ["-o"]["--out"]
            ("output filename")
            | Opt(setReporter, "name")
            ["-r"]["--reporter"]
            ("reporter to use (defaults to console)")
            | Opt(config.name, "name")
            ["-n"]["--name"]
            ("suite name")
            | Opt([&](bool) { config.abortAfter = 1; })
            ["-a"]["--abort"]
            ("abort at first failure")
            | Opt([&](int x) { config.abortAfter = x; }, "no. failures")
            ["-x"]["--abortx"]
            ("abort after x failures")
            | Opt(setWarning, "warning name")
            ["-w"]["--warn"]
            ("enable warnings")
            | Opt([&](bool flag) { config.showDurations = flag ? ShowDurations::Always : ShowDurations::Never; }, "yes|no")
            ["-d"]["--durations"]
            ("show test durations")
            | Opt(config.minDuration, "seconds")
            ["-D"]["--min-duration"]
            ("show test durations for tests taking at least the given number of seconds")
            | Opt(loadTestNamesFromFile, "filename")
            ["-f"]["--input-file"]
            ("load test names to run from a file")
            | Opt(config.filenamesAsTags)
            ["-#"]["--filenames-as-tags"]
            ("adds a tag for the filename")
            | Opt(config.sectionsToRun, "section name")
            ["-c"]["--section"]
            ("specify section to run")
            | Opt(setVerbosity, "quiet|normal|high")
            ["-v"]["--verbosity"]
            ("set output verbosity")
            | Opt(config.listTestNamesOnly)
            ["--list-test-names-only"]
        ("list all/matching test cases names only")
            | Opt(config.listReporters)
            ["--list-reporters"]
        ("list all reporters")
            | Opt(setTestOrder, "decl|lex|rand")
            ["--order"]
        ("test case order (defaults to decl)")
            | Opt(setRngSeed, "'time'|number")
            ["--rng-seed"]
        ("set a specific seed for random numbers")
            | Opt(setColourUsage, "yes|no")
            ["--use-colour"]
        ("should output be colourised")
            | Opt(config.libIdentify)
            ["--libidentify"]
        ("report name and version according to libidentify standard")
            | Opt(setWaitForKeypress, "never|start|exit|both")
            ["--wait-for-keypress"]
        ("waits for a keypress before exiting")
            | Opt(config.benchmarkSamples, "samples")
            ["--benchmark-samples"]
        ("number of samples to collect (default: 100)")
            | Opt(config.benchmarkResamples, "resamples")
            ["--benchmark-resamples"]
        ("number of resamples for the bootstrap (default: 100000)")
            | Opt(config.benchmarkConfidenceInterval, "confidence interval")
            ["--benchmark-confidence-interval"]
        ("confidence interval for the bootstrap (between 0 and 1, default: 0.95)")
            | Opt(config.benchmarkNoAnalysis)
            ["--benchmark-no-analysis"]
        ("perform only measurements; do not perform any analysis")
            | Opt(config.benchmarkWarmupTime, "benchmarkWarmupTime")
            ["--benchmark-warmup-time"]
        ("amount of time in milliseconds spent on warming up each test (default: 100)")
            | Arg(config.testsOrTags, "test name|pattern|tags")
            ("which test or tests to use");

        return cli;
    }